

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O2

asn_dec_rval_t
OCTET_STRING_decode_uper
          (asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  asn_OS_Subvariant aVar1;
  size_t units;
  bool bVar2;
  int32_t iVar3;
  uint uVar4;
  long *plVar5;
  uint8_t *puVar6;
  ssize_t sVar7;
  void *pvVar8;
  int iVar9;
  ulong uVar10;
  asn_per_constraint_s *paVar11;
  asn_OCTET_STRING_specifics_t *paVar12;
  ulong uVar13;
  asn_per_constraints_t *paVar14;
  uint unit_bits;
  long lVar15;
  asn_dec_rval_t aVar16;
  size_t sVar17;
  undefined8 uVar18;
  int repeat;
  asn_per_constraints_t *local_48;
  ulong local_40;
  size_t local_38;
  
  paVar12 = &asn_DEF_OCTET_STRING_specs;
  if ((asn_OCTET_STRING_specifics_t *)td->specifics != (asn_OCTET_STRING_specifics_t *)0x0) {
    paVar12 = (asn_OCTET_STRING_specifics_t *)td->specifics;
  }
  if (constraints == (asn_per_constraints_t *)0x0) {
    constraints = td->per_constraints;
  }
  paVar14 = constraints;
  if (constraints == (asn_per_constraints_t *)0x0) {
    paVar14 = &asn_DEF_OCTET_STRING_constraints;
  }
  paVar11 = &paVar14->size;
  aVar1 = paVar12->subvariant;
  uVar10 = (ulong)aVar1;
  sVar17 = 0;
  uVar18 = 2;
  if (3 < aVar1 - ASN_OSUBV_BIT) goto LAB_001475e1;
  plVar5 = (long *)*sptr;
  switch(aVar1) {
  case ASN_OSUBV_BIT:
    bVar2 = true;
    uVar13 = uVar10;
    goto LAB_00147383;
  case ASN_OSUBV_STR:
    sVar17 = 1;
    uVar13 = 8;
    break;
  case ASN_OSUBV_U16:
    uVar13 = 0x10;
    sVar17 = 2;
    break;
  case ASN_OSUBV_U32:
    uVar13 = 0x20;
    sVar17 = 4;
  }
  if (((paVar14->value).flags & APC_CONSTRAINED) == APC_UNCONSTRAINED) {
    bVar2 = false;
    uVar10 = uVar13;
  }
  else {
    bVar2 = false;
    uVar10 = (ulong)(uint)(paVar14->value).range_bits;
  }
LAB_00147383:
  uVar4 = (uint)uVar13;
  local_48 = constraints;
  if (plVar5 == (long *)0x0) {
    plVar5 = (long *)calloc(1,(long)paVar12->struct_size);
    *sptr = plVar5;
    if (plVar5 != (long *)0x0) goto LAB_001473a8;
LAB_0014754d:
    uVar18 = 2;
  }
  else {
LAB_001473a8:
    if (((paVar14->size).flags & APC_EXTENSIBLE) != APC_UNCONSTRAINED) {
      iVar3 = per_get_few_bits(pd,1);
      if (iVar3 == 0) {
        uVar4 = (uint)uVar10;
      }
      else {
        paVar11 = &asn_DEF_OCTET_STRING_constraints.size;
        paVar14 = &asn_DEF_OCTET_STRING_constraints;
      }
      uVar10 = (ulong)uVar4;
      if (iVar3 < 0) {
        sVar17 = 0;
        uVar18 = 1;
        goto LAB_001475e1;
      }
    }
    uVar4 = (uint)sVar17;
    unit_bits = (uint)uVar10;
    if (paVar11->effective_bits < 0) {
LAB_00147440:
      *(undefined4 *)(plVar5 + 1) = 0;
      local_40 = uVar10;
      local_38 = sVar17;
      do {
        sVar7 = uper_get_length(pd,paVar11->effective_bits,&repeat);
        if (sVar7 < 0) {
LAB_0014753e:
          uVar18 = 1;
          goto LAB_00147541;
        }
        uVar10 = sVar7 + paVar11->lower_bound;
        if (bVar2) {
          lVar15 = (long)(uVar10 + 7) >> 3;
          uVar13 = uVar10;
          if ((uVar10 & 7) != 0) {
            *(int *)((long)plVar5 + 0xc) = 8 - (int)(uVar10 & 7);
          }
        }
        else {
          lVar15 = uVar10 * local_38;
          uVar13 = lVar15 * local_40;
        }
        pvVar8 = realloc((void *)*plVar5,lVar15 + (int)plVar5[1] + 1);
        if (pvVar8 == (void *)0x0) goto LAB_0014754d;
        *plVar5 = (long)pvVar8;
        puVar6 = (uint8_t *)((long)(int)plVar5[1] + (long)pvVar8);
        if (bVar2) {
          iVar9 = per_get_many_bits(pd,puVar6,0,(int)uVar13);
        }
        else {
          iVar9 = OCTET_STRING_per_get_characters
                            (pd,puVar6,uVar10,uVar4,unit_bits,(paVar14->value).lower_bound,
                             (paVar14->value).upper_bound,local_48);
          if (0 < iVar9) goto LAB_0014754d;
        }
        if (iVar9 < 0) goto LAB_0014753e;
        iVar9 = (int)lVar15 + (int)plVar5[1];
        *(int *)(plVar5 + 1) = iVar9;
      } while (repeat != 0);
      *(undefined1 *)(*plVar5 + (long)iVar9) = 0;
      uVar18 = 0;
LAB_00147541:
      sVar17 = 0;
      goto LAB_001475e1;
    }
    free((void *)*plVar5);
    units = paVar11->upper_bound;
    iVar9 = uVar4 * (int)units;
    if (bVar2) {
      iVar9 = (int)(units + 7 >> 3);
    }
    *(int *)(plVar5 + 1) = iVar9;
    puVar6 = (uint8_t *)malloc((long)(iVar9 + 1));
    *plVar5 = (long)puVar6;
    if (puVar6 == (uint8_t *)0x0) {
      *(undefined4 *)(plVar5 + 1) = 0;
      goto LAB_0014754d;
    }
    if (paVar11->effective_bits != 0) goto LAB_00147440;
    if (bVar2) {
      iVar9 = per_get_many_bits(pd,puVar6,0,(int)units * unit_bits);
    }
    else {
      iVar9 = OCTET_STRING_per_get_characters
                        (pd,puVar6,units,uVar4,unit_bits,(paVar14->value).lower_bound,
                         (paVar14->value).upper_bound,local_48);
      if (0 < iVar9) goto LAB_0014754d;
    }
    if (-1 < iVar9) {
      sVar17 = uVar10 * paVar11->upper_bound;
      *(undefined1 *)(*plVar5 + (long)(int)plVar5[1]) = 0;
      if (bVar2) {
        uVar4 = (uint)paVar11->upper_bound & 7;
        iVar9 = 8 - uVar4;
        if (uVar4 == 0) {
          iVar9 = 0;
        }
        *(int *)((long)plVar5 + 0xc) = iVar9;
      }
      uVar18 = 0;
      goto LAB_001475e1;
    }
    uVar18 = 1;
  }
  sVar17 = 0;
LAB_001475e1:
  aVar16.consumed = sVar17;
  aVar16._0_8_ = uVar18;
  return aVar16;
}

Assistant:

asn_dec_rval_t
OCTET_STRING_decode_uper(asn_codec_ctx_t *opt_codec_ctx,
	asn_TYPE_descriptor_t *td, asn_per_constraints_t *constraints,
	void **sptr, asn_per_data_t *pd) {

	asn_OCTET_STRING_specifics_t *specs = td->specifics
		? (asn_OCTET_STRING_specifics_t *)td->specifics
		: &asn_DEF_OCTET_STRING_specs;
	asn_per_constraints_t *pc = constraints ? constraints
				: td->per_constraints;
	asn_per_constraint_t *cval;
	asn_per_constraint_t *csiz;
	asn_dec_rval_t rval = { RC_OK, 0 };
	BIT_STRING_t *st = (BIT_STRING_t *)*sptr;
	ssize_t consumed_myself = 0;
	int repeat;
	enum {
		OS__BPC_BIT	= 0,
		OS__BPC_CHAR	= 1,
		OS__BPC_U16	= 2,
		OS__BPC_U32	= 4
	} bpc;	/* Bytes per character */
	unsigned int unit_bits;
	unsigned int canonical_unit_bits;

	(void)opt_codec_ctx;

	if(pc) {
		cval = &pc->value;
		csiz = &pc->size;
	} else {
		cval = &asn_DEF_OCTET_STRING_constraints.value;
		csiz = &asn_DEF_OCTET_STRING_constraints.size;
	}

	switch(specs->subvariant) {
	default:
	case ASN_OSUBV_ANY:
		ASN_DEBUG("Unrecognized subvariant %d", specs->subvariant);
		RETURN(RC_FAIL);
	case ASN_OSUBV_BIT:
		canonical_unit_bits = unit_bits = 1;
		bpc = OS__BPC_BIT;
		break;
	case ASN_OSUBV_STR:
		canonical_unit_bits = unit_bits = 8;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_CHAR;
		break;
	case ASN_OSUBV_U16:
		canonical_unit_bits = unit_bits = 16;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_U16;
		break;
	case ASN_OSUBV_U32:
		canonical_unit_bits = unit_bits = 32;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_U32;
		break;
	}

	/*
	 * Allocate the string.
	 */
	if(!st) {
		st = (BIT_STRING_t *)(*sptr = CALLOC(1, specs->struct_size));
		if(!st) RETURN(RC_FAIL);
	}

	ASN_DEBUG("PER Decoding %s size %ld .. %ld bits %d",
		csiz->flags & APC_EXTENSIBLE ? "extensible" : "non-extensible",
		csiz->lower_bound, csiz->upper_bound, csiz->effective_bits);

	if(csiz->flags & APC_EXTENSIBLE) {
		int inext = per_get_few_bits(pd, 1);
		if(inext < 0) RETURN(RC_WMORE);
		if(inext) {
			csiz = &asn_DEF_OCTET_STRING_constraints.size;
			cval = &asn_DEF_OCTET_STRING_constraints.value;
			unit_bits = canonical_unit_bits;
		}
	}

	if(csiz->effective_bits >= 0) {
		FREEMEM(st->buf);
		if(bpc) {
			st->size = csiz->upper_bound * bpc;
		} else {
			st->size = (csiz->upper_bound + 7) >> 3;
		}
		st->buf = (uint8_t *)MALLOC(st->size + 1);
		if(!st->buf) { st->size = 0; RETURN(RC_FAIL); }
	}

	/* X.691, #16.5: zero-length encoding */
	/* X.691, #16.6: short fixed length encoding (up to 2 octets) */
	/* X.691, #16.7: long fixed length encoding (up to 64K octets) */
	if(csiz->effective_bits == 0) {
		int ret;
		if(bpc) {
			ASN_DEBUG("Encoding OCTET STRING size %ld",
				csiz->upper_bound);
			ret = OCTET_STRING_per_get_characters(pd, st->buf,
				csiz->upper_bound, bpc, unit_bits,
				cval->lower_bound, cval->upper_bound, pc);
			if(ret > 0) RETURN(RC_FAIL);
		} else {
			ASN_DEBUG("Encoding BIT STRING size %ld",
				csiz->upper_bound);
			ret = per_get_many_bits(pd, st->buf, 0,
					    unit_bits * csiz->upper_bound);
		}
		if(ret < 0) RETURN(RC_WMORE);
		consumed_myself += unit_bits * csiz->upper_bound;
		st->buf[st->size] = 0;
		if(bpc == 0) {
			int ubs = (csiz->upper_bound & 0x7);
			st->bits_unused = ubs ? 8 - ubs : 0;
		}
		RETURN(RC_OK);
	}

	st->size = 0;
	do {
		ssize_t raw_len;
		ssize_t len_bytes;
		ssize_t len_bits;
		void *p;
		int ret;

		/* Get the PER length */
		raw_len = uper_get_length(pd, csiz->effective_bits, &repeat);
		if(raw_len < 0) RETURN(RC_WMORE);
		raw_len += csiz->lower_bound;

		ASN_DEBUG("Got PER length eb %ld, len %ld, %s (%s)",
			(long)csiz->effective_bits, (long)raw_len,
			repeat ? "repeat" : "once", td->name);
		if(bpc) {
			len_bytes = raw_len * bpc;
			len_bits = len_bytes * unit_bits;
		} else {
			len_bits = raw_len;
			len_bytes = (len_bits + 7) >> 3;
			if(len_bits & 0x7)
				st->bits_unused = 8 - (len_bits & 0x7);
			/* len_bits be multiple of 16K if repeat is set */
		}
		p = REALLOC(st->buf, st->size + len_bytes + 1);
		if(!p) RETURN(RC_FAIL);
		st->buf = (uint8_t *)p;

		if(bpc) {
			ret = OCTET_STRING_per_get_characters(pd,
				&st->buf[st->size], raw_len, bpc, unit_bits,
				cval->lower_bound, cval->upper_bound, pc);
			if(ret > 0) RETURN(RC_FAIL);
		} else {
			ret = per_get_many_bits(pd, &st->buf[st->size],
				0, len_bits);
		}
		if(ret < 0) RETURN(RC_WMORE);
		st->size += len_bytes;
	} while(repeat);
	st->buf[st->size] = 0;	/* nul-terminate */

	return rval;
}